

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ServiceDescriptor *desc)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string classname;
  string local_58;
  string local_38;
  
  lVar1 = **(long **)(this + 8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,lVar1,(*(long **)(this + 8))[1] + lVar1);
  plVar3 = (long *)(*(ulong *)(*(long *)(*(FileDescriptor **)(this + 0x10) + 0x78) + 0x78) &
                   0xfffffffffffffffe);
  lVar1 = plVar3[1];
  if (lVar1 == 0) {
    anon_unknown_2::ReservedNamePrefix(&local_38,&local_58,*(FileDescriptor **)(this + 0x10));
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    lVar2 = *plVar3;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,lVar2,lVar1 + lVar2);
  }
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const ServiceDescriptor* desc) {
  std::string classname = desc->name();
  return ClassNamePrefix(classname, desc) + classname;
}